

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_referenceType_withStorage
          (sysbvm_context_t *context,sysbvm_tuple_t referenceType,sysbvm_tuple_t storage)

{
  _Bool _Var1;
  sysbvm_object_tuple_t *psVar2;
  
  _Var1 = sysbvm_type_isReferenceType(referenceType);
  if (!_Var1) {
    sysbvm_error("Expected a reference type");
  }
  psVar2 = sysbvm_context_allocatePointerTuple(context,referenceType,1);
  (psVar2->field_1).pointers[0] = storage;
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_referenceType_withStorage(sysbvm_context_t *context, sysbvm_tuple_t referenceType, sysbvm_tuple_t storage)
{
    if(!sysbvm_type_isReferenceType(referenceType))
        sysbvm_error("Expected a reference type");

    sysbvm_object_tuple_t *reference = sysbvm_context_allocatePointerTuple(context, referenceType, 1);
    reference->pointers[0] = storage;
    return (sysbvm_tuple_t)reference;
}